

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O1

bool __thiscall
kj::MainBuilder::Impl::OptionDisplayOrder::operator()(OptionDisplayOrder *this,Option *a,Option *b)

{
  OptionName *pOVar1;
  size_t sVar2;
  OptionName *pOVar3;
  size_t sVar4;
  int iVar5;
  size_t sVar6;
  long lVar7;
  ulong __n;
  char cVar8;
  char cVar9;
  char *__s;
  ulong uVar10;
  ulong uVar11;
  char *__s_00;
  bool bVar12;
  
  if (a != b) {
    pOVar1 = (a->names).ptr;
    sVar2 = (a->names).size_;
    if (sVar2 == 0) {
      cVar8 = '\0';
    }
    else {
      cVar8 = '\0';
      lVar7 = 0;
      do {
        if ((&pOVar1->isLong)[lVar7] == true) {
          if (cVar8 == '\0') {
            cVar8 = **(char **)((long)&pOVar1->field_1 + lVar7);
          }
        }
        else {
          cVar8 = *(char *)((long)&pOVar1->field_1 + lVar7);
        }
      } while (((&pOVar1->isLong)[lVar7] != false) &&
              (bVar12 = sVar2 * 0x10 + -0x10 != lVar7, lVar7 = lVar7 + 0x10, bVar12));
    }
    pOVar3 = (b->names).ptr;
    sVar4 = (b->names).size_;
    if (sVar4 == 0) {
      cVar9 = '\0';
    }
    else {
      cVar9 = '\0';
      lVar7 = 0;
      do {
        if ((&pOVar3->isLong)[lVar7] == true) {
          if (cVar9 == '\0') {
            cVar9 = **(char **)((long)&pOVar3->field_1 + lVar7);
          }
        }
        else {
          cVar9 = *(char *)((long)&pOVar3->field_1 + lVar7);
        }
      } while (((&pOVar3->isLong)[lVar7] != false) &&
              (bVar12 = sVar4 * 0x10 + -0x10 != lVar7, lVar7 = lVar7 + 0x10, bVar12));
    }
    if (cVar8 < cVar9) {
      return true;
    }
    if (cVar8 <= cVar9) {
      uVar11 = 1;
      __s_00 = "";
      __s = "";
      uVar10 = 1;
      if (sVar2 != 0) {
        lVar7 = 0;
        do {
          if ((&pOVar1->isLong)[lVar7] == true) {
            __s = *(char **)((long)&pOVar1->field_1 + lVar7);
            sVar6 = strlen(__s);
            uVar10 = sVar6 + 1;
            goto LAB_0020c590;
          }
          lVar7 = lVar7 + 0x10;
        } while (sVar2 << 4 != lVar7);
        __s = "";
        uVar10 = 1;
      }
LAB_0020c590:
      if (sVar4 != 0) {
        lVar7 = 0;
        do {
          if ((&pOVar3->isLong)[lVar7] == true) {
            __s_00 = *(char **)((long)&pOVar3->field_1 + lVar7);
            sVar6 = strlen(__s_00);
            uVar11 = sVar6 + 1;
            break;
          }
          lVar7 = lVar7 + 0x10;
        } while (sVar4 << 4 != lVar7);
      }
      __n = uVar11;
      if (uVar10 < uVar11) {
        __n = uVar10;
      }
      iVar5 = memcmp(__s,__s_00,__n);
      if (iVar5 < 0) {
        return true;
      }
      return iVar5 == 0 && uVar10 < uVar11;
    }
  }
  return false;
}

Assistant:

bool operator()(const Option* a, const Option* b) const {
    if (a == b) return false;

    char aShort = '\0';
    char bShort = '\0';

    for (auto& name: a->names) {
      if (name.isLong) {
        if (aShort == '\0') {
          aShort = name.longName[0];
        }
      } else {
        aShort = name.shortName;
        break;
      }
    }
    for (auto& name: b->names) {
      if (name.isLong) {
        if (bShort == '\0') {
          bShort = name.longName[0];
        }
      } else {
        bShort = name.shortName;
        break;
      }
    }

    if (aShort < bShort) return true;
    if (aShort > bShort) return false;

    StringPtr aLong;
    StringPtr bLong;

    for (auto& name: a->names) {
      if (name.isLong) {
        aLong = name.longName;
        break;
      }
    }
    for (auto& name: b->names) {
      if (name.isLong) {
        bLong = name.longName;
        break;
      }
    }

    return aLong < bLong;
  }